

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1client.c
# Opt level: O1

h2o_http1client_body_cb
on_head(h2o_http1client_t *client,char *errstr,int minor_version,int status,h2o_iovec_t msg,
       h2o_header_t *headers,size_t num_headers,int rlen)

{
  h2o_mem_pool_t *pool;
  h2o_headers_t *headers_00;
  uint64_t *puVar1;
  h2o_generator_t *generator;
  h2o_req_t *phVar2;
  h2o_token_t *token;
  h2o_req_overrides_t *phVar3;
  h2o_url_t *phVar4;
  h2o_url_scheme_t *phVar5;
  size_t test_len;
  ulong __n;
  char *pcVar6;
  h2o_timeout_t *phVar7;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  uint16_t uVar11;
  int iVar12;
  uint uVar13;
  size_t sVar14;
  long lVar15;
  h2o_socket_t *phVar16;
  undefined8 *user_data;
  uint16_t uVar17;
  h2o_http1client_ctx_t *phVar18;
  size_t *psVar19;
  code *pcVar20;
  char cVar21;
  h2o_iovec_t hVar22;
  h2o_iovec_t hVar23;
  h2o_url_t loc_parsed;
  h2o_iovec_t local_88;
  char *local_78;
  undefined8 local_70;
  char *local_68;
  size_t sStack_60;
  char *local_58;
  size_t sStack_50;
  char *local_48;
  long local_40;
  
  generator = (h2o_generator_t *)client->data;
  phVar2 = (h2o_req_t *)generator[1].proceed;
  if (errstr == "end of stream" || errstr == (char *)0x0) {
    (phVar2->res).status = status;
    pool = &phVar2->pool;
    hVar22 = h2o_strdup(pool,msg.base,msg.len);
    (phVar2->res).reason = hVar22.base;
    if (num_headers != 0) {
      headers_00 = &(phVar2->res).headers;
      psVar19 = &(headers->value).len;
      do {
        iVar12 = h2o_iovec_is_token((h2o_iovec_t *)psVar19[-3]);
        token = (h2o_token_t *)psVar19[-3];
        if (iVar12 == 0) {
          hVar22 = h2o_strdup(pool,(token->buf).base,(token->buf).len);
          hVar23 = h2o_strdup(pool,((h2o_iovec_t *)(psVar19 + -1))->base,*psVar19);
          h2o_add_header_by_str
                    (pool,headers_00,hVar22.base,hVar22.len,0,(char *)psVar19[-2],hVar23.base,
                     hVar23.len);
        }
        else {
          if ((token->field_0x11 & 2) == 0) {
            if (token != h2o__tokens + 0x14) {
              if (token == h2o__tokens + 0x28) {
                if (((status != 0x130) && (status - 300U < 100)) && ((phVar2->field_0x1e8 & 2) != 0)
                   ) {
                  generator[1].stop = (_func_void_st_h2o_generator_t_ptr_h2o_req_t_ptr *)0x0;
                  hVar22 = h2o_get_redirect_method(phVar2->method,status);
                  iVar12 = 1;
                  h2o_send_redirect_internal
                            (phVar2,hVar22,((h2o_iovec_t *)(psVar19 + -1))->base,*psVar19,1);
                  goto LAB_00138c55;
                }
                phVar3 = phVar2->overrides;
                if ((phVar3 == (h2o_req_overrides_t *)0x0) ||
                   (phVar4 = (phVar3->location_rewrite).match, phVar4 == (h2o_url_t *)0x0))
                goto LAB_00138c29;
                phVar5 = (phVar2->input).scheme;
                pcVar8 = (phVar3->location_rewrite).path_prefix.base;
                sVar14 = (phVar3->location_rewrite).path_prefix.len;
                pcVar9 = (phVar2->input).authority.base;
                sVar10 = (phVar2->input).authority.len;
                iVar12 = h2o_url_parse(((h2o_iovec_t *)(psVar19 + -1))->base,*psVar19,&loc_parsed);
                if (iVar12 == 0) {
                  hVar22 = (h2o_iovec_t)ZEXT816(0);
                  if (loc_parsed.scheme == &H2O_URL_SCHEME_HTTP) {
                    test_len = (phVar4->host).len;
                    uVar13 = 0;
                    if (loc_parsed.host.len == test_len) {
                      if (((loc_parsed.host.len < 5) || (*loc_parsed.host.base != 'u')) ||
                         (*(int *)(loc_parsed.host.base + 1) != 0x3a78696e)) {
                        uVar13 = h2o__lcstris_core(loc_parsed.host.base,(phVar4->host).base,test_len
                                                  );
                      }
                      else {
                        pcVar6 = (phVar4->host).base;
                        if (*pcVar6 == 'u') {
                          iVar12 = bcmp(loc_parsed.host.base + 1,pcVar6 + 1,test_len - 1);
                          uVar13 = (uint)(iVar12 == 0);
                        }
                      }
                    }
                    pcVar6 = loc_parsed.path.base;
                    if (uVar13 != 0) {
                      uVar11 = loc_parsed._port;
                      if (loc_parsed._port == 0xffff) {
                        uVar11 = (loc_parsed.scheme)->default_port;
                      }
                      uVar17 = phVar4->_port;
                      if (uVar17 == 0xffff) {
                        uVar17 = phVar4->scheme->default_port;
                      }
                      if (uVar11 == uVar17) {
                        __n = (phVar4->path).len;
                        lVar15 = loc_parsed.path.len - __n;
                        if ((__n <= loc_parsed.path.len) &&
                           (iVar12 = bcmp(loc_parsed.path.base,(phVar4->path).base,__n), iVar12 == 0
                           )) {
                          local_88.base = (phVar5->name).base;
                          local_88.len = (phVar5->name).len;
                          local_78 = "://";
                          local_70 = 3;
                          local_48 = pcVar6 + __n;
                          local_68 = pcVar9;
                          sStack_60 = sVar10;
                          local_58 = pcVar8;
                          sStack_50 = sVar14;
                          local_40 = lVar15;
                          hVar22 = h2o_concat_list(pool,&local_88,5);
                          goto LAB_00138bf7;
                        }
                      }
                    }
                    goto LAB_00138bf1;
                  }
                }
                else {
LAB_00138bf1:
                  hVar22 = (h2o_iovec_t)ZEXT816(0);
                }
LAB_00138bf7:
                if (hVar22.base == (char *)0x0) goto LAB_00138c29;
              }
              else {
                if (token == h2o__tokens + 0x27) {
                  hVar22 = h2o_push_path_in_link_header
                                     (phVar2,((h2o_iovec_t *)(psVar19 + -1))->base,*psVar19);
                  if (hVar22.len == 0) {
                    iVar12 = 5;
                  }
                  else {
                    ((h2o_iovec_t *)(psVar19 + -1))->base = hVar22.base;
                    *psVar19 = hVar22.len;
                    iVar12 = 0;
                  }
                  if (iVar12 != 0) {
                    if (iVar12 == 5) goto LAB_00138c52;
                    goto LAB_00138c55;
                  }
                }
                else if (token == h2o__tokens + 0x30) {
                  if (((phVar2->conn->ctx->globalconf->proxy).field_0x10 & 2) == 0)
                  goto LAB_00138c52;
                }
                else if (token == h2o__tokens + 0x3a) {
                  if (*psVar19 == 3) {
                    iVar12 = h2o__lcstris_core(((h2o_iovec_t *)(psVar19 + -1))->base,"off",3);
                    cVar21 = iVar12 != 0;
                  }
                  else {
                    if (*psVar19 == 2) {
                      iVar12 = h2o__lcstris_core(((h2o_iovec_t *)(psVar19 + -1))->base,"on",2);
                      cVar21 = '\x02';
                      if (iVar12 != 0) goto LAB_00138c72;
                    }
                    cVar21 = '\0';
                  }
LAB_00138c72:
                  phVar2->compress_hint = cVar21;
                  goto LAB_00138c52;
                }
LAB_00138c29:
                hVar22 = h2o_strdup(pool,((h2o_iovec_t *)(psVar19 + -1))->base,*psVar19);
              }
              h2o_add_header(pool,headers_00,token,(char *)psVar19[-2],hVar22.base,hVar22.len);
              goto LAB_00138c52;
            }
            if ((phVar2->res).content_length == 0xffffffffffffffff) {
              sVar14 = h2o_strtosize(((h2o_iovec_t *)(psVar19 + -1))->base,*psVar19);
              (phVar2->res).content_length = sVar14;
              if (sVar14 != 0xffffffffffffffff) goto LAB_00138c52;
            }
            generator[1].stop = (_func_void_st_h2o_generator_t_ptr_h2o_req_t_ptr *)0x0;
            h2o_req_log_error(phVar2,"lib/core/proxy.c","%s",
                              "invalid response from upstream (malformed content-length)");
            puVar1 = phVar2->conn->ctx->emitted_error_status + 8;
            *puVar1 = *puVar1 + 1;
            h2o_send_error_generic(phVar2,0x1f6,"Gateway Error","invalid response from upstream",0);
            iVar12 = 1;
          }
          else {
LAB_00138c52:
            iVar12 = 0;
          }
LAB_00138c55:
          if (iVar12 != 0) {
            return (h2o_http1client_body_cb)0x0;
          }
        }
        psVar19 = psVar19 + 4;
        num_headers = num_headers - 1;
      } while (num_headers != 0);
    }
    if ((*(int *)&generator[6].proceed == 0) || ((phVar2->res).status != 0x65)) {
      h2o_start_response(phVar2,generator);
      if (errstr == "end of stream") {
        generator[1].stop = (_func_void_st_h2o_generator_t_ptr_h2o_req_t_ptr *)0x0;
        pcVar20 = (h2o_http1client_body_cb)0x0;
        h2o_send(phVar2,(h2o_iovec_t *)0x0,0,H2O_SEND_STATE_FINAL);
      }
      else {
        pcVar20 = on_body;
      }
    }
    else {
      if ((phVar2->overrides == (h2o_req_overrides_t *)0x0) ||
         (phVar18 = phVar2->overrides->client_ctx, phVar18 == (h2o_http1client_ctx_t *)0x0)) {
        phVar18 = &(phVar2->conn->ctx->proxy).client_ctx;
      }
      if (phVar18->websocket_timeout == (h2o_timeout_t *)0x0) {
        __assert_fail("client_ctx->websocket_timeout != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/core/proxy.c"
                      ,0x1e8,
                      "h2o_http1client_body_cb on_head(h2o_http1client_t *, const char *, int, int, h2o_iovec_t, h2o_header_t *, size_t, int)"
                     );
      }
      h2o_add_header(pool,&(phVar2->res).headers,h2o__tokens + 0x35,(char *)0x0,"websocket",9);
      phVar7 = phVar18->websocket_timeout;
      phVar2 = (h2o_req_t *)generator[1].proceed;
      phVar16 = h2o_http1client_steal_socket((h2o_http1client_t *)generator[1].stop);
      h2o_buffer_consume(&phVar16->input,(long)rlen);
      user_data = (undefined8 *)malloc(0x18);
      if (user_data == (undefined8 *)0x0) {
        h2o__fatal(
                  "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/include/h2o/memory.h:330:no memory"
                  );
      }
      user_data[2] = phVar16;
      user_data[1] = phVar7;
      *user_data = phVar2->conn->ctx;
      pcVar20 = (h2o_http1client_body_cb)0x0;
      h2o_http1_upgrade(phVar2,(h2o_iovec_t *)0x0,0,on_websocket_upgrade_complete,user_data);
      generator[1].stop = (_func_void_st_h2o_generator_t_ptr_h2o_req_t_ptr *)0x0;
    }
  }
  else {
    generator[1].stop = (_func_void_st_h2o_generator_t_ptr_h2o_req_t_ptr *)0x0;
    pcVar20 = (h2o_http1client_body_cb)0x0;
    h2o_req_log_error(phVar2,"lib/core/proxy.c","%s",errstr);
    puVar1 = phVar2->conn->ctx->emitted_error_status + 8;
    *puVar1 = *puVar1 + 1;
    h2o_send_error_generic(phVar2,0x1f6,"Gateway Error",errstr,0);
  }
  return pcVar20;
}

Assistant:

static void on_head(h2o_socket_t *sock, const char *err)
{
    struct st_h2o_http1client_private_t *client = sock->data;
    int minor_version, http_status, rlen, is_eos;
    const char *msg;
#define MAX_HEADERS 100
    h2o_header_t *headers;
    h2o_iovec_t *header_names;
    size_t msg_len, num_headers, i;
    h2o_socket_cb reader;
    h2o_mem_pool_t pool;

    h2o_timeout_unlink(&client->_timeout);

    if (err != NULL) {
        on_error_before_head(client, "I/O error (head)");
        return;
    }

    h2o_mem_init_pool(&pool);

    headers = h2o_mem_alloc_pool(&pool, sizeof(*headers) * MAX_HEADERS);
    header_names = h2o_mem_alloc_pool(&pool, sizeof(*header_names) * MAX_HEADERS);

    /* continue parsing the responses until we see a final one */
    while (1) {
        /* parse response */
        struct phr_header src_headers[MAX_HEADERS];
        num_headers = MAX_HEADERS;
        rlen = phr_parse_response(sock->input->bytes, sock->input->size, &minor_version, &http_status, &msg, &msg_len, src_headers,
                                  &num_headers, 0);
        switch (rlen) {
        case -1: /* error */
            on_error_before_head(client, "failed to parse the response");
            goto Exit;
        case -2: /* incomplete */
            h2o_timeout_link(client->super.ctx->loop, client->super.ctx->io_timeout, &client->_timeout);
            goto Exit;
        }
        /* fill-in the headers */
        for (i = 0; i != num_headers; ++i) {
            const h2o_token_t *token;
            char *orig_name = h2o_strdup(&pool, src_headers[i].name, src_headers[i].name_len).base;
            h2o_strtolower((char *)src_headers[i].name, src_headers[i].name_len);
            token = h2o_lookup_token(src_headers[i].name, src_headers[i].name_len);
            if (token != NULL) {
                headers[i].name = (h2o_iovec_t *)&token->buf;
            } else {
                header_names[i] = h2o_iovec_init(src_headers[i].name, src_headers[i].name_len);
                headers[i].name = &header_names[i];
            }
            headers[i].value = h2o_iovec_init(src_headers[i].value, src_headers[i].value_len);
            headers[i].orig_name = orig_name;
        }

        if (!(100 <= http_status && http_status <= 199 && http_status != 101))
            break;

        if (client->super.informational_cb != NULL &&
            client->super.informational_cb(&client->super, minor_version, http_status, h2o_iovec_init(msg, msg_len), headers,
                                           num_headers) != 0) {
            close_client(client);
            goto Exit;
        }
        h2o_buffer_consume(&client->super.sock->input, rlen);
        if (client->super.sock->input->size == 0) {
            h2o_timeout_link(client->super.ctx->loop, client->super.ctx->io_timeout, &client->_timeout);
            goto Exit;
        }
    }

    /* parse the headers */
    reader = on_body_until_close;
    client->_can_keepalive = minor_version >= 1;
    for (i = 0; i != num_headers; ++i) {
        if (headers[i].name == &H2O_TOKEN_CONNECTION->buf) {
            if (h2o_contains_token(headers[i].value.base, headers[i].value.len, H2O_STRLIT("keep-alive"), ',')) {
                client->_can_keepalive = 1;
            } else {
                client->_can_keepalive = 0;
            }
        } else if (headers[i].name == &H2O_TOKEN_TRANSFER_ENCODING->buf) {
            if (h2o_memis(headers[i].value.base, headers[i].value.len, H2O_STRLIT("chunked"))) {
                /* precond: _body_decoder.chunked is zero-filled */
                client->_body_decoder.chunked.decoder.consume_trailer = 1;
                reader = on_body_chunked;
            } else if (h2o_memis(headers[i].value.base, headers[i].value.len, H2O_STRLIT("identity"))) {
                /* continue */
            } else {
                on_error_before_head(client, "unexpected type of transfer-encoding");
                goto Exit;
            }
        } else if (headers[i].name == &H2O_TOKEN_CONTENT_LENGTH->buf) {
            if ((client->_body_decoder.content_length.bytesleft = h2o_strtosize(headers[i].value.base, headers[i].value.len)) ==
                SIZE_MAX) {
                on_error_before_head(client, "invalid content-length");
                goto Exit;
            }
            if (reader != on_body_chunked)
                reader = on_body_content_length;
        }
    }

    /* RFC 2616 4.4 */
    if (client->_method_is_head || http_status == 101 || http_status == 204 || http_status == 304) {
        is_eos = 1;
    } else {
        is_eos = 0;
        /* close the connection if impossible to determine the end of the response (RFC 7230 3.3.3) */
        if (reader == on_body_until_close)
            client->_can_keepalive = 0;
    }

    /* call the callback. sock may be stealed and stealed sock need rlen.*/
    client->_cb.on_body = client->_cb.on_head(&client->super, is_eos ? h2o_http1client_error_is_eos : NULL, minor_version,
                                              http_status, h2o_iovec_init(msg, msg_len), headers, num_headers, rlen);

    if (is_eos) {
        close_client(client);
        goto Exit;
    } else if (client->_cb.on_body == NULL) {
        client->_can_keepalive = 0;
        close_client(client);
        goto Exit;
    }

    h2o_buffer_consume(&client->super.sock->input, rlen);
    client->super.sock->bytes_read = client->super.sock->input->size;

    client->_timeout.cb = on_body_timeout;
    h2o_socket_read_start(sock, reader);
    reader(client->super.sock, 0);

Exit:
    h2o_mem_clear_pool(&pool);
#undef MAX_HEADERS
}